

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

const_iterator __thiscall VarnodeBank::beginLoc(VarnodeBank *this,int4 s,Address *addr,uint4 fl)

{
  pointer *pppVVar1;
  key_type local_170;
  _Base_ptr local_168;
  undefined1 local_160 [8];
  PcodeOp searchop;
  SeqNum sq;
  undefined1 local_c0 [8];
  PcodeOp searchop_1;
  SeqNum sq_1;
  uint4 fl_local;
  Address *addr_local;
  int4 s_local;
  VarnodeBank *this_local;
  const_iterator iter;
  
  std::_Rb_tree_const_iterator<Varnode_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<Varnode_*> *)&this_local);
  if (fl == 8) {
    (this->searchvn).size = s;
    Address::operator=(&(this->searchvn).loc,addr);
    sq_1._16_8_ = &this->searchvn;
    this_local = (VarnodeBank *)
                 std::set<Varnode_*,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>::lower_bound
                           (&this->loc_tree,(key_type *)&sq_1.uniq);
    (this->searchvn).size = 0;
  }
  else if (fl == 0x10) {
    pppVVar1 = &searchop_1.inrefs.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    SeqNum::SeqNum((SeqNum *)pppVVar1,m_minimal);
    PcodeOp::PcodeOp((PcodeOp *)local_c0,0,(SeqNum *)pppVVar1);
    (this->searchvn).size = s;
    Address::operator=(&(this->searchvn).loc,addr);
    sq._16_8_ = &this->searchvn;
    (this->searchvn).flags = 0x10;
    (this->searchvn).def = (PcodeOp *)local_c0;
    this_local = (VarnodeBank *)
                 std::set<Varnode_*,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>::lower_bound
                           (&this->loc_tree,(key_type *)&sq.uniq);
    (this->searchvn).size = 0;
    (this->searchvn).flags = 8;
    PcodeOp::~PcodeOp((PcodeOp *)local_c0);
  }
  else {
    pppVVar1 = &searchop.inrefs.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    SeqNum::SeqNum((SeqNum *)pppVVar1,m_maximal);
    PcodeOp::PcodeOp((PcodeOp *)local_160,0,(SeqNum *)pppVVar1);
    (this->searchvn).size = s;
    Address::operator=(&(this->searchvn).loc,addr);
    local_170 = &this->searchvn;
    (this->searchvn).flags = 0x10;
    (this->searchvn).def = (PcodeOp *)local_160;
    local_168 = (_Base_ptr)
                std::set<Varnode_*,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>::upper_bound
                          (&this->loc_tree,&local_170);
    (this->searchvn).size = 0;
    (this->searchvn).flags = 8;
    this_local = (VarnodeBank *)local_168;
    PcodeOp::~PcodeOp((PcodeOp *)local_160);
  }
  return (const_iterator)(_Base_ptr)this_local;
}

Assistant:

VarnodeLocSet::const_iterator VarnodeBank::beginLoc(int4 s,const Address &addr,
						    uint4 fl) const
{
  VarnodeLocSet::const_iterator iter;

  if (fl == Varnode::input) {
    searchvn.size = s;
    searchvn.loc = addr;
    iter = loc_tree.lower_bound(&searchvn);
    searchvn.size = 0;
    return iter;
  }
  if (fl == Varnode::written) {
    SeqNum sq(Address::m_minimal); // Minimal sequence number
    PcodeOp searchop(0,sq);
    searchvn.size = s;
    searchvn.loc = addr;
    searchvn.flags = Varnode::written;
    searchvn.def = &searchop;
    iter = loc_tree.lower_bound(&searchvn);
    searchvn.size = 0;
    searchvn.flags = Varnode::input;
    return iter;
  }

  SeqNum sq(Address::m_maximal); // Maximal sequence number
  PcodeOp searchop(0,sq);
  searchvn.size = s;
  searchvn.loc = addr;
  searchvn.flags = Varnode::written;
  searchvn.def = &searchop;
  iter = loc_tree.upper_bound(&searchvn);
  searchvn.size = 0;
  searchvn.flags = Varnode::input;

  return iter;
}